

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperBase::InsertLocalMinima(ClipperBase *this,LocalMinima *newLm)

{
  bool bVar1;
  LocalMinima *local_20;
  LocalMinima *tmpLm;
  LocalMinima *newLm_local;
  ClipperBase *this_local;
  
  if (this->m_MinimaList == (LocalMinima *)0x0) {
    this->m_MinimaList = newLm;
  }
  else if (newLm->Y < this->m_MinimaList->Y) {
    local_20 = this->m_MinimaList;
    while( true ) {
      bVar1 = false;
      if (local_20->next != (LocalMinima *)0x0) {
        bVar1 = newLm->Y < local_20->next->Y;
      }
      if (!bVar1) break;
      local_20 = local_20->next;
    }
    newLm->next = local_20->next;
    local_20->next = newLm;
  }
  else {
    newLm->next = this->m_MinimaList;
    this->m_MinimaList = newLm;
  }
  return;
}

Assistant:

void ClipperBase::InsertLocalMinima(LocalMinima *newLm)
{
  if( ! m_MinimaList )
  {
    m_MinimaList = newLm;
  }
  else if( newLm->Y >= m_MinimaList->Y )
  {
    newLm->next = m_MinimaList;
    m_MinimaList = newLm;
  } else
  {
    LocalMinima* tmpLm = m_MinimaList;
    while( tmpLm->next  && ( newLm->Y < tmpLm->next->Y ) )
      tmpLm = tmpLm->next;
    newLm->next = tmpLm->next;
    tmpLm->next = newLm;
  }
}